

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleAverageVerifier::verify
          (SampleAverageVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (float)(*(uint *)ctx >> 8 & 0xff) / 255.0 + -0.5;
  fVar2 = (float)(*(uint *)ctx >> 0x10 & 0xff) / 255.0 + -0.5;
  fVar3 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar3 = fVar1;
  }
  fVar1 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar1 = fVar2;
  }
  return -(uint)(fVar1 < this->m_distanceThreshold && fVar3 < this->m_distanceThreshold) &
         0xffffff01;
}

Assistant:

int			getBlue					(void) const { return (int)((m_value >> (deUint32)BLUE_SHIFT)  & 0xFFu); }